

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

dtree_node_t * best_leaf_node(dtree_node_t *node)

{
  dtree_node_t *pdVar1;
  dtree_node_t *pdVar2;
  dtree_node_t *pdVar3;
  
  if ((node->y == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    return node;
  }
  pdVar1 = best_leaf_node(node->y);
  pdVar2 = best_leaf_node(node->n);
  if ((pdVar1 == (dtree_node_t *)0x0) || (pdVar1->q == (void *)0x0)) {
    if (pdVar2 == (dtree_node_t *)0x0) {
      return (dtree_node_t *)0x0;
    }
    pdVar3 = pdVar2;
    if (pdVar2->q == (void *)0x0) {
      pdVar3 = (dtree_node_t *)0x0;
    }
    if (pdVar1 == (dtree_node_t *)0x0) {
      return pdVar3;
    }
    if (pdVar2->q == (void *)0x0) {
      return pdVar3;
    }
  }
  pdVar3 = pdVar2;
  if ((((pdVar1->q != (void *)0x0) && (pdVar3 = pdVar1, pdVar2 != (dtree_node_t *)0x0)) &&
      (pdVar2->q != (void *)0x0)) &&
     (pdVar3 = pdVar2,
     (double)pdVar2->wt_ent_dec <= (double)pdVar1->wt_ent_dec &&
     (double)pdVar1->wt_ent_dec != (double)pdVar2->wt_ent_dec)) {
    pdVar3 = pdVar1;
  }
  return pdVar3;
}

Assistant:

dtree_node_t *
best_leaf_node(dtree_node_t *node)
{
    dtree_node_t *cmp_y, *cmp_n, *ret;

    ret = NULL;

    if (IS_LEAF(node)) {
	ret = node;
    }
    else {
	cmp_y = best_leaf_node(node->y);
	cmp_n = best_leaf_node(node->n);

	if ((cmp_y == NULL || cmp_y->q == NULL) &&
	    (cmp_n == NULL || cmp_n->q == NULL)) {
	    return NULL;
	}
	else if ((cmp_y == NULL) || (cmp_y->q == NULL)) {
	    ret = cmp_n;
	}
	else if ((cmp_n == NULL) || (cmp_n->q == NULL)) {
	    ret = cmp_y;
	}
	else if (cmp_y->wt_ent_dec > cmp_n->wt_ent_dec) {
	    ret = cmp_y;
	}
	else {
	    ret = cmp_n;
	}
    }

    return ret;
}